

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyRead.c
# Opt level: O2

Abc_TtStore_t * setTtStore(char *pFileInput)

{
  char cVar1;
  char *pcVar2;
  Abc_TtStore_t *pAVar3;
  word **ppwVar4;
  word *pwVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  
  pcVar2 = Abc_FileRead(pFileInput);
  uVar12 = 0;
  iVar15 = 0;
  if (pcVar2 != (char *)0x0) {
    for (uVar16 = 0; cVar1 = pcVar2[uVar16], cVar1 != '\0'; uVar16 = uVar16 + 1) {
      if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == ' ')) goto LAB_0048b826;
    }
    puts("Strange, the input file does not have spaces and new-lines...");
LAB_0048b826:
    cVar1 = *pcVar2;
    if (cVar1 == '0') {
      uVar12 = (uint)uVar16 - 2;
      if (pcVar2[1] != 'x') {
        uVar12 = (uint)uVar16;
      }
      uVar16 = (ulong)uVar12;
    }
    for (uVar12 = 0; uVar12 != 0x20; uVar12 = uVar12 + 1) {
      if ((int)uVar16 << 2 == 1 << ((byte)uVar12 & 0x1f)) {
        if (0xfffffff0 < uVar12 - 0x11) {
          iVar15 = 0;
          while (pcVar2 = pcVar2 + 1, cVar1 != '\0') {
            iVar15 = iVar15 + (uint)(cVar1 == '\n');
            cVar1 = *pcVar2;
          }
          goto LAB_0048b87a;
        }
        break;
      }
    }
    puts("Does not look like the input file contains truth tables...");
    uVar12 = 0;
    iVar15 = 0;
  }
LAB_0048b87a:
  pAVar3 = (Abc_TtStore_t *)malloc(0x18);
  pAVar3->nVars = uVar12;
  bVar6 = (char)uVar12 - 6;
  iVar9 = 1 << (bVar6 & 0x1f);
  if (uVar12 < 7) {
    iVar9 = 1;
  }
  pAVar3->nWords = iVar9;
  pAVar3->nFuncs = iVar15;
  bVar14 = 0;
  if (uVar12 >= 7) {
    bVar14 = bVar6;
  }
  ppwVar4 = (word **)malloc((long)iVar15 * 8);
  pAVar3->pFuncs = ppwVar4;
  pwVar5 = (word *)calloc(8,(long)(iVar15 << (bVar14 & 0x1f)));
  *ppwVar4 = pwVar5;
  for (uVar16 = 1; uVar16 < (ulong)(long)iVar15; uVar16 = uVar16 + 1) {
    ppwVar4[uVar16] = ppwVar4[uVar16 - 1] + iVar9;
  }
  pcVar2 = Abc_FileRead(pFileInput);
  if (pcVar2 != (char *)0x0) {
    bVar14 = (char)uVar12 - 2U & 0x1f;
    uVar7 = 0x10 << (bVar6 & 0x1f);
    if (uVar12 < 7) {
      uVar7 = 1 << bVar14;
    }
    uVar16 = (ulong)(uint)(0 << bVar14);
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    lVar13 = 0;
    while( true ) {
      lVar13 = (long)(int)lVar13;
      if (pcVar2[lVar13] == '\n') break;
      pcVar10 = pcVar2 + lVar13;
      if (pcVar2[lVar13] == '0') {
        pcVar10 = pcVar10 + (ulong)(pcVar10[1] == 'x') * 2;
      }
      if ((0x20 < (ulong)(byte)pcVar10[(int)uVar7]) ||
         ((0x100002401U >> ((ulong)(byte)pcVar10[(int)uVar7] & 0x3f) & 1) == 0)) {
        pcVar10 = 
        "EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
        ;
        pcVar2 = "void Abc_TruthReadHex(word *, char *, int)";
        uVar12 = 0x45;
LAB_0048ba68:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                      ,uVar12,pcVar2);
      }
      pwVar5 = ppwVar4[uVar16];
      uVar16 = uVar16 + 1;
      for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
        bVar6 = pcVar10[(int)(~(uint)uVar8 + uVar7)];
        iVar9 = -0x30;
        if (((9 < (byte)(bVar6 - 0x30)) && (iVar9 = -0x37, 5 < (byte)(bVar6 + 0xbf))) &&
           (iVar9 = -0x57, 5 < (byte)(bVar6 + 0x9f))) {
          pcVar10 = "0";
          pcVar2 = "int Abc_TruthReadHexDigit(char)";
          uVar12 = 0x29;
          goto LAB_0048ba68;
        }
        pwVar5[uVar8 >> 4 & 0xfffffff] =
             pwVar5[uVar8 >> 4 & 0xfffffff] |
             (ulong)(iVar9 + (uint)bVar6) << ((char)uVar8 * '\x04' & 0x3fU);
      }
      do {
        pcVar10 = pcVar2 + lVar13;
        lVar13 = lVar13 + 1;
      } while (*pcVar10 != '\n');
    }
    if (iVar15 < (int)uVar16) {
      __assert_fail("p->nFuncs >= nLines",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                    ,0xe8,"void Abc_TruthStoreRead(char *, Abc_TtStore_t *)");
    }
    pAVar3->nFuncs = (int)uVar16;
  }
  return pAVar3;
}

Assistant:

Abc_TtStore_t * setTtStore(char * pFileInput)
{
    int nVars, nTruths;
    Abc_TtStore_t * p;
    // figure out how many truth table and how many variables
    Abc_TruthGetParams( pFileInput, &nVars, &nTruths );
    // allocate data-structure
    p = Abc_TruthStoreAlloc( nVars, nTruths );

    Abc_TruthStoreRead( pFileInput, p );
    return p;
}